

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::FoldTranspose
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  Constant *matrix_00;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  int iVar4;
  TypeManager *this;
  Type *pTVar5;
  const_reference ppCVar6;
  undefined4 extraout_var;
  Type *result_type;
  Constant *matrix;
  TypeManager *type_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 != OpTranspose) {
    __assert_fail("inst->opcode() == spv::Op::OpTranspose",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x195,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldTranspose(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  this = IRContext::get_type_mgr(context);
  bVar1 = opt::Instruction::IsFloatingPointFoldingAllowed(inst);
  if (!bVar1) {
    uVar3 = opt::Instruction::type_id(inst);
    pTVar5 = analysis::TypeManager::GetType(this,uVar3);
    bVar1 = HasFloatingPoint(pTVar5);
    if (bVar1) {
      return (Constant *)0x0;
    }
  }
  ppCVar6 = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::operator[](constants,0);
  matrix_00 = *ppCVar6;
  if (matrix_00 == (Constant *)0x0) {
    context_local = (IRContext *)0x0;
  }
  else {
    uVar3 = opt::Instruction::type_id(inst);
    pTVar5 = analysis::TypeManager::GetType(this,uVar3);
    iVar4 = (*pTVar5->_vptr_Type[0xf])();
    context_local =
         (IRContext *)TransposeMatrix(matrix_00,(Matrix *)CONCAT44(extraout_var,iVar4),context);
  }
  return (Constant *)context_local;
}

Assistant:

const analysis::Constant* FoldTranspose(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpTranspose);

  analysis::TypeManager* type_mgr = context->get_type_mgr();
  if (!inst->IsFloatingPointFoldingAllowed()) {
    if (HasFloatingPoint(type_mgr->GetType(inst->type_id()))) {
      return nullptr;
    }
  }

  const analysis::Constant* matrix = constants[0];
  if (matrix == nullptr) {
    return nullptr;
  }

  auto* result_type = type_mgr->GetType(inst->type_id());
  return TransposeMatrix(matrix, result_type->AsMatrix(), context);
}